

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log_store.cxx
# Opt level: O2

void test_log_store_compact_random(void)

{
  pointer psVar1;
  pointer psVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  const_iterator __first;
  EVP_PKEY_CTX *ctx;
  fs_log_store *this;
  size_t i;
  ulong uVar9;
  bool bVar10;
  ptr<log_entry> entry;
  ptr<log_entry> entry_3;
  _Any_data local_1a98;
  code *local_1a88;
  code *local_1a80;
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  entries;
  fs_log_store store;
  random_device rd;
  
  ctx = (EVP_PKEY_CTX *)&rd;
  std::random_device::random_device((random_device *)ctx);
  uVar4 = std::random_device::_M_getval();
  iVar8 = (int)((uVar4 & 0xffffffff) % 0x7fffffff);
  local_1a98._8_8_ = ZEXT48(iVar8 + (uint)(iVar8 == 0));
  local_1a98._M_unused._M_object = (void *)0x271000000001;
  local_1a80 = std::
               _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/tests/src/test_log_store.cxx:310:34)>
               ::_M_invoke;
  local_1a88 = std::
               _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/tests/src/test_log_store.cxx:310:34)>
               ::_M_manager;
  cleanup(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&entries,".",(allocator<char> *)&entry);
  cornerstone::fs_log_store::fs_log_store(&store,(string *)&entries,1000);
  std::__cxx11::string::~string((string *)&entries);
  iVar3 = std::function<int_()>::operator()((function<int_()> *)&local_1a98);
  entries.
  super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  entries.
  super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  entries.
  super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar8 = -100;
  if (-100 < iVar3 % 1000) {
    iVar8 = iVar3 % 1000;
  }
  iVar8 = iVar8 + 100;
  while (psVar2 = entries.
                  super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        psVar1 = entries.
                 super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, bVar10 = iVar8 != 0, iVar8 = iVar8 + -1,
        bVar10) {
    rnd_entry((function<int_()> *)&entry);
    cornerstone::fs_log_store::append(&store,&entry);
    std::
    vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
    ::push_back(&entries,&entry);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&entry.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  iVar8 = std::function<int_()>::operator()((function<int_()> *)&local_1a98);
  uVar9 = 0;
  uVar4 = (ulong)(long)iVar8 % (((long)psVar2 - (long)psVar1 >> 4) - 10U);
  while( true ) {
    uVar5 = cornerstone::fs_log_store::next_slot(&store);
    if ((uVar5 - uVar4) - 2 <= uVar9) break;
    cornerstone::fs_log_store::start_index(&store);
    cornerstone::fs_log_store::entry_at((fs_log_store *)&entry,(ulong)&store);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&entry.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    uVar9 = uVar9 + 1;
  }
  iVar8 = std::function<int_()>::operator()((function<int_()> *)&local_1a98);
  uVar5 = cornerstone::fs_log_store::next_slot(&store);
  uVar6 = cornerstone::fs_log_store::start_index(&store);
  uVar7 = cornerstone::fs_log_store::start_index(&store);
  rnd_entry((function<int_()> *)&entry);
  uVar7 = (ulong)(long)iVar8 % (uVar5 - uVar6) + uVar7;
  cornerstone::fs_log_store::write_at(&store,uVar7,&entry);
  std::__shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&entries.
              super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar7 - 1].
              super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>,
             &entry.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>);
  __first._M_current =
       entries.
       super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
       ._M_impl.super__Vector_impl_data._M_start + uVar7;
  std::
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  ::erase(&entries,__first,
          (const_iterator)
          entries.
          super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  uVar9 = 0;
  while( true ) {
    uVar5 = cornerstone::fs_log_store::next_slot(&store);
    if ((uVar5 - uVar4) - 2 <= uVar9) break;
    cornerstone::fs_log_store::start_index(&store);
    __first._M_current = (shared_ptr<cornerstone::log_entry> *)&store;
    cornerstone::fs_log_store::entry_at((fs_log_store *)&entry_3,(ulong)&store);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&entry_3.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    uVar9 = uVar9 + 1;
  }
  iVar3 = std::function<int_()>::operator()((function<int_()> *)&local_1a98);
  iVar8 = -10;
  if (-10 < iVar3 % 100) {
    iVar8 = iVar3 % 100;
  }
  iVar8 = iVar8 + 10;
  while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
    rnd_entry((function<int_()> *)&entry_3);
    std::
    vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
    ::push_back(&entries,(value_type *)&entry_3);
    __first._M_current = (shared_ptr<cornerstone::log_entry> *)&entry_3;
    cornerstone::fs_log_store::append(&store,(ptr<log_entry> *)&entry_3);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&entry_3.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  uVar9 = 0;
  while( true ) {
    iVar8 = (int)__first._M_current;
    uVar5 = cornerstone::fs_log_store::next_slot(&store);
    if ((uVar5 - uVar4) - 2 <= uVar9) break;
    cornerstone::fs_log_store::start_index(&store);
    __first._M_current = (shared_ptr<cornerstone::log_entry> *)&store;
    cornerstone::fs_log_store::entry_at((fs_log_store *)&entry_3,(ulong)&store);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&entry_3.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    uVar9 = uVar9 + 1;
  }
  this = &store;
  cornerstone::fs_log_store::close(this,iVar8);
  cleanup((EVP_PKEY_CTX *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&entry.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  ::~vector(&entries);
  cornerstone::fs_log_store::~fs_log_store(&store);
  std::_Function_base::~_Function_base((_Function_base *)&local_1a98);
  std::random_device::~random_device(&rd);
  return;
}

Assistant:

void test_log_store_compact_random()
{
    std::random_device rd;
    std::default_random_engine engine(rd());
    std::uniform_int_distribution<int32> distribution(1, 10000);
    std::function<int32()> rnd = [distribution, engine]() mutable -> int32_t { return distribution(engine); };

    cleanup();
    fs_log_store store(".", 1000);
    int cnt = rnd() % 1000 + 100;
    std::vector<ptr<log_entry>> entries;
    for (int i = 0; i < cnt; ++i)
    {
        ptr<log_entry> entry(rnd_entry(rnd));
        store.append(entry);
        entries.push_back(entry);
    }

    ulong last_log_idx = entries.size();
    ulong idx_to_compact = rnd() % (last_log_idx - 10) + 1;
    assert(store.compact(idx_to_compact));

    assert(store.start_index() == (idx_to_compact + 1));
    assert(store.next_slot() == (entries.size() + 1));

    for (size_t i = 0; i < store.next_slot() - idx_to_compact - 1; ++i)
    {
        ptr<log_entry> entry = store.entry_at(store.start_index() + i);
        assert(entry_equals(*entry, *entries[i + (size_t)idx_to_compact]));
    }

    ulong rnd_idx = (ulong)rnd() % (store.next_slot() - store.start_index()) + store.start_index();
    ptr<log_entry> entry = rnd_entry(rnd);
    store.write_at(rnd_idx, entry);
    entries[(size_t)rnd_idx - 1] = entry;
    entries.erase(entries.begin() + (size_t)rnd_idx, entries.end());

    for (size_t i = 0; i < store.next_slot() - idx_to_compact - 1; ++i)
    {
        ptr<log_entry> entry = store.entry_at(store.start_index() + i);
        assert(entry_equals(*entry, *entries[i + (size_t)idx_to_compact]));
    }

    cnt = rnd() % 100 + 10;
    for (int i = 0; i < cnt; ++i)
    {
        ptr<log_entry> entry = rnd_entry(rnd);
        entries.push_back(entry);
        store.append(entry);
    }

    for (size_t i = 0; i < store.next_slot() - idx_to_compact - 1; ++i)
    {
        ptr<log_entry> entry = store.entry_at(store.start_index() + i);
        assert(entry_equals(*entry, *entries[i + (size_t)idx_to_compact]));
    }
    store.close();
    cleanup();
}